

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.C
# Opt level: O0

bool __thiscall Filter::matchDir(Filter *this,string *name)

{
  bool bVar1;
  int iVar2;
  list<String,_std::allocator<String>_> *plVar3;
  reference __pattern;
  pointer this_00;
  bool local_39;
  _Self local_30;
  _Self local_28;
  const_iterator it;
  bool match;
  string *name_local;
  Filter *this_local;
  
  plVar3 = Args::includeDirs_abi_cxx11_(this->m_args);
  it._M_node._7_1_ = std::__cxx11::list<String,_std::allocator<String>_>::empty(plVar3);
  plVar3 = Args::includeDirs_abi_cxx11_(this->m_args);
  local_28._M_node =
       (_List_node_base *)std::__cxx11::list<String,_std::allocator<String>_>::begin(plVar3);
  while( true ) {
    local_39 = false;
    if ((it._M_node._7_1_ & 1) == 0) {
      plVar3 = Args::includeDirs_abi_cxx11_(this->m_args);
      local_30._M_node =
           (_List_node_base *)std::__cxx11::list<String,_std::allocator<String>_>::end(plVar3);
      local_39 = std::operator!=(&local_28,&local_30);
    }
    if (local_39 == false) break;
    __pattern = std::_List_const_iterator<String>::operator*(&local_28);
    this_00 = std::_List_const_iterator<String>::operator->(&local_28);
    bVar1 = String::noCase(this_00);
    iVar2 = fnmatch((char *)__pattern,(char *)name,(uint)bVar1);
    it._M_node._7_1_ = (byte)iVar2 & 1;
    std::_List_const_iterator<String>::operator++(&local_28);
  }
  return (bool)(it._M_node._7_1_ & 1);
}

Assistant:

bool Filter::matchDir(std::string const & name) const
{
    bool match = m_args.includeDirs().empty();

    // Include filters
    std::list<String>::const_iterator it = m_args.includeDirs().begin();
    for (; !match && it != m_args.includeDirs().end(); ++it) {
		match = fnmatch(*it, name, it->noCase());
    }

    return match;
}